

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderMouseCursor
               (ImVec2 base_pos,float base_scale,ImGuiMouseCursor mouse_cursor,ImU32 col_fill,
               ImU32 col_border,ImU32 col_shadow)

{
  ImGuiViewportP *this;
  ImTextureID texture_id;
  ImU32 col;
  bool bVar1;
  ImGuiViewportP **ppIVar2;
  ImDrawList *this_00;
  int i;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar3;
  float fVar4;
  ImRect IVar5;
  ImVec2 pos;
  ImVec2 uv [4];
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImGuiMouseCursor local_c8;
  ImU32 local_c4;
  ImU32 local_c0;
  ImU32 local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ImFontAtlas *local_a8;
  ImVector<ImGuiViewportP_*> *local_a0;
  ImVec2 local_98;
  ImVec2 IStack_90;
  ImVec2 local_88;
  ImVec2 IStack_80;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [24];
  
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = base_pos;
  local_48._12_4_ = in_XMM0_Dd;
  local_c4 = col_fill;
  local_c0 = col_border;
  local_bc = col_shadow;
  if (8 < (uint)mouse_cursor) {
    __assert_fail("mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0xcbe,
                  "void ImGui::RenderMouseCursor(ImVec2, float, ImGuiMouseCursor, ImU32, ImU32, ImU32)"
                 );
  }
  local_a8 = ((GImGui->DrawListSharedData).Font)->ContainerAtlas;
  local_a0 = &GImGui->Viewports;
  fStack_64 = 2.0;
  fStack_60 = 0.0;
  fStack_5c = 0.0;
  local_c8 = mouse_cursor;
  local_68 = base_scale;
  for (i = 0; i < local_a0->Size; i = i + 1) {
    local_d0.x = 0.0;
    local_d0.y = 0.0;
    local_e8.x = 0.0;
    local_e8.y = 0.0;
    local_88.x = 0.0;
    local_88.y = 0.0;
    IStack_80.x = 0.0;
    IStack_80.y = 0.0;
    local_98.x = 0.0;
    local_98.y = 0.0;
    IStack_90.x = 0.0;
    IStack_90.y = 0.0;
    bVar1 = ImFontAtlas::GetMouseCursorTexData
                      (local_a8,mouse_cursor,&local_d0,&local_e8,&local_98,&local_88);
    if (bVar1) {
      ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](local_a0,i);
      this = *ppIVar2;
      local_f0.y = (float)local_48._4_4_ - local_d0.y;
      local_f0.x = (float)local_48._0_4_ - local_d0.x;
      _local_78 = ZEXT416((uint)(this->super_ImGuiViewport).DpiScale);
      IVar5 = ImGuiViewportP::GetMainRect(this);
      if (local_f0.y < IVar5.Max.y) {
        fVar3 = (float)local_78._0_4_ * local_68;
        fVar4 = (float)local_78._4_4_ * fStack_60;
        if (((IVar5.Min.y < local_f0.y + (local_e8.y + 2.0) * fVar3) && (local_f0.x < IVar5.Max.x))
           && (IVar5.Min.x < local_f0.x + (local_e8.x + fStack_64) * fVar3)) {
          local_78._4_4_ = local_e8.x + fStack_64;
          local_78._0_4_ = fVar3;
          fStack_70 = fVar4;
          fStack_6c = fStack_5c * 0.0;
          local_b8 = fVar3;
          fStack_b4 = local_e8.x * fStack_64;
          fStack_b0 = fVar4;
          fStack_ac = fStack_5c * 0.0;
          this_00 = GetForegroundDrawList(&this->super_ImGuiViewport);
          texture_id = local_a8->TexID;
          ImDrawList::PushTextureID(this_00,texture_id);
          col = local_bc;
          fStack_b4 = local_b8;
          fStack_b0 = local_b8;
          fStack_ac = local_b8;
          local_58 = local_b8 * 2.0;
          fStack_54 = local_b8 * 0.0;
          fStack_50 = local_b8 * 0.0;
          fStack_4c = local_b8 * 0.0;
          local_e0.y = fStack_54 + local_f0.y;
          local_e0.x = (float)local_78._0_4_ + local_f0.x;
          local_d8.y = (local_e8.y + 0.0) * local_b8 + local_f0.y;
          local_d8.x = (local_e8.x + 1.0) * local_b8 + local_f0.x;
          ImDrawList::AddImage(this_00,texture_id,&local_e0,&local_d8,&local_88,&IStack_80,local_bc)
          ;
          local_e0.y = fStack_54 + local_f0.y;
          local_e0.x = local_58 + local_f0.x;
          local_d8.y = (local_e8.y + 0.0) * fStack_b4 + local_f0.y;
          local_d8.x = (local_e8.x + 2.0) * local_b8 + local_f0.x;
          ImDrawList::AddImage(this_00,texture_id,&local_e0,&local_d8,&local_88,&IStack_80,col);
          local_e0.y = local_f0.y + local_e8.y * fStack_b4;
          local_e0.x = local_f0.x + local_e8.x * local_b8;
          ImDrawList::AddImage(this_00,texture_id,&local_f0,&local_e0,&local_88,&IStack_80,local_c0)
          ;
          mouse_cursor = local_c8;
          local_e0.y = local_f0.y + local_e8.y * fStack_b4;
          local_e0.x = local_f0.x + local_e8.x * local_b8;
          ImDrawList::AddImage(this_00,texture_id,&local_f0,&local_e0,&local_98,&IStack_90,local_c4)
          ;
          ImDrawList::PopTextureID(this_00);
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImVec2 base_pos, float base_scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);
    ImFontAtlas* font_atlas = g.DrawListSharedData.Font->ContainerAtlas;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        // We scale cursor with current viewport/monitor, however Windows 10 for its own hardware cursor seems to be using a different scale factor.
        ImVec2 offset, size, uv[4];
        if (!font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
            continue;
        ImGuiViewportP* viewport = g.Viewports[n];
        const ImVec2 pos = base_pos - offset;
        const float scale = base_scale * viewport->DpiScale;
        if (!viewport->GetMainRect().Overlaps(ImRect(pos, pos + ImVec2(size.x + 2, size.y + 2) * scale)))
            continue;
        ImDrawList* draw_list = GetForegroundDrawList(viewport);
        ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1, 0) * scale, pos + (ImVec2(1, 0) + size) * scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2, 0) * scale, pos + (ImVec2(2, 0) + size) * scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                  uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                  uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}